

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxParser.cpp
# Opt level: O1

bool __thiscall Jinx::Impl::Parser::CheckValueType(Parser *this)

{
  SymbolType SVar1;
  Symbol *pSVar2;
  byte bVar3;
  
  if (((this->m_error == false) &&
      (pSVar2 = (this->m_currentSymbol)._M_current,
      (this->m_symbolList->
      super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>)._M_impl.
      super__Vector_impl_data._M_finish != pSVar2)) && (SVar1 = pSVar2->type, SVar1 < To)) {
    bVar3 = (byte)(0x40308c0c80000000 >> ((byte)SVar1 & 0x3f));
  }
  else {
    bVar3 = 0;
  }
  return (bool)(bVar3 & 1);
}

Assistant:

inline_t bool Parser::CheckValueType(SymbolListCItr currSym) const
	{
		if (m_error || currSym == m_symbolList.end())
			return false;
		auto type = currSym->type;
		return
			type == SymbolType::Number ||
			type == SymbolType::Integer ||
			type == SymbolType::Boolean ||
			type == SymbolType::String ||
			type == SymbolType::Collection ||
			type == SymbolType::Function ||
			type == SymbolType::Coroutine ||
			type == SymbolType::Guid ||
			type == SymbolType::Null;

	}